

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_gleam.cxx
# Opt level: O2

void shade_rect_top_bottom(int x,int y,int w,int h,Fl_Color fg1,Fl_Color fg2,float th)

{
  int iVar1;
  int iVar2;
  Fl_Color FVar3;
  uint uVar4;
  uint uVar5;
  float fVar6;
  float fVar7;
  float local_60;
  
  iVar1 = 0x14;
  if (h < 0x28) {
    iVar1 = h / 2;
  }
  iVar2 = 0xf;
  if (h < 0x5a) {
    iVar2 = h / 6;
  }
  fVar7 = 1.0;
  if (iVar1 < 2) {
    local_60 = 1.0;
  }
  else {
    local_60 = 0.999 / (float)iVar1;
  }
  fVar6 = 0.999 / (float)iVar2;
  uVar5 = y;
  for (; 0.0 <= fVar7; fVar7 = fVar7 - local_60) {
    FVar3 = fl_color_average(fg1,fg2,th);
    FVar3 = fl_color_average(FVar3,fg1,fVar7);
    Fl::set_box_color(FVar3);
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[6])
              (fl_graphics_driver,(ulong)(uint)x,(ulong)uVar5,(ulong)(uint)(w + x));
    uVar5 = uVar5 + 1;
  }
  uVar4 = h - (iVar2 + iVar1);
  if (iVar2 < 2) {
    fVar6 = 1.0;
  }
  Fl::set_box_color(fg1);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[4])
            (fl_graphics_driver,(ulong)(uint)x,(ulong)(uint)(iVar1 + y),(ulong)(w + 1),(ulong)uVar4)
  ;
  uVar5 = (uVar5 + uVar4) - 1;
  for (fVar7 = 1.0; 0.0 <= fVar7; fVar7 = fVar7 - fVar6) {
    FVar3 = fl_color_average(fg1,fg2,th);
    FVar3 = fl_color_average(fg1,FVar3,fVar7);
    Fl::set_box_color(FVar3);
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[6])
              (fl_graphics_driver,(ulong)(uint)x,(ulong)uVar5,(ulong)(uint)(w + x));
    uVar5 = uVar5 + 1;
  }
  return;
}

Assistant:

static void shade_rect_top_bottom(int x, int y, int w, int h, Fl_Color fg1, Fl_Color fg2, float th) {
  // Draws the shiny using maximum limits
  int h_top    = ((h/2) < (20) ? (h/2) : (20)); // min(h/2,20);
  int h_bottom = ((h/6) < (15) ? (h/6) : (15)); // min(h/6,15);
  int h_flat = h-(h_top+h_bottom);
  int j = 0;
  float step_size_top = h_top>1?(0.999f/(float)(h_top)):1;
  float step_size_bottom = h_bottom>1?(0.999f/(float)(h_bottom)):1;
  // This loop generates the gradient at the top of the widget
  for (float k = 1; k >= 0; k -= step_size_top){
    gleam_color(fl_color_average(fl_color_average(fg1, fg2, th), fg1, k));
    fl_xyline(x, y+j, x+w);
    j++;
  }
  gleam_color(fg1);
  fl_rectf(x, y+h_top, w+1, h_flat);
  // This loop generates the gradient at the bottom of the widget
  for (float k = 1; k >= 0; k -= step_size_bottom){
    gleam_color(fl_color_average(fg1,fl_color_average(fg1, fg2, th), k));
    fl_xyline(x, y+j+h_flat-1, x+w);
    j++;
  }
}